

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6392::FloatxNanInfTest_DIV_2_47_simple_Test::TestBody
          (FloatxNanInfTest_DIV_2_47_simple_Test *this)

{
  char *pcVar1;
  fp_t dynamicnan;
  AssertionResult gtest_ar;
  T c;
  T b;
  T a;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  AssertHelper local_78;
  flexfloat_t local_70;
  AssertHelper local_60;
  flexfloat_t local_58;
  flexfloat_t local_40;
  flexfloat_t local_30;
  
  local_30.value = -3.5427134999999997e-15;
  local_30.desc.exp_bits = '\x02';
  local_30.desc.frac_bits = '/';
  flexfloat_sanitize(&local_30);
  local_40.value = -5.921189166666666e-16;
  local_40.desc.exp_bits = '\x02';
  local_40.desc.frac_bits = '/';
  flexfloat_sanitize(&local_40);
  local_58.value = 0.0;
  local_58.desc.exp_bits = '\x02';
  local_58.desc.frac_bits = '/';
  flexfloat_sanitize(&local_58);
  local_70.value = local_30.value / local_40.value;
  local_70.desc.exp_bits = '\x02';
  local_70.desc.frac_bits = '/';
  flexfloat_sanitize(&local_70);
  local_58._10_6_ = local_70._10_6_;
  local_58.desc = local_70.desc;
  local_58.value = local_70.value;
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30.value;
  local_78.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_70,"fp_t(a)","0.00000000000000000000",(double *)&local_80,
             (double *)&local_78);
  if (local_70.value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)CONCAT62(local_70._10_6_,local_70.desc) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT62(local_70._10_6_,local_70.desc);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/NanInf.cpp"
               ,0x68,pcVar1);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(local_70._10_6_,local_70.desc) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70.desc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(local_70._10_6_,local_70.desc));
  }
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.value;
  local_78.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_70,"fp_t(b)","0.00000000000000000000",(double *)&local_80,
             (double *)&local_78);
  if (local_70.value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)CONCAT62(local_70._10_6_,local_70.desc) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT62(local_70._10_6_,local_70.desc);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/NanInf.cpp"
               ,0x69,pcVar1);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(local_70._10_6_,local_70.desc) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70.desc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(local_70._10_6_,local_70.desc));
  }
  testing::internal::
  CmpHelperNE<flexfloat<(unsigned_char)2,(unsigned_char)47>,flexfloat<(unsigned_char)2,(unsigned_char)47>>
            ((internal *)&local_70,"c","c",
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> *)&local_58,
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> *)&local_58);
  if (local_70.value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)CONCAT62(local_70._10_6_,local_70.desc) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT62(local_70._10_6_,local_70.desc);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/NanInf.cpp"
               ,0x6a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(local_70._10_6_,local_70.desc) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70.desc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(local_70._10_6_,local_70.desc));
  }
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7ff8000000000000
  ;
  testing::internal::CmpHelperNE<flexfloat<(unsigned_char)2,(unsigned_char)47>,double>
            ((internal *)&local_70,"c","fp_t(0.0 / 0.0)",
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> *)&local_58,(double *)&local_80);
  if (local_70.value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)CONCAT62(local_70._10_6_,local_70.desc) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT62(local_70._10_6_,local_70.desc);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/NanInf.cpp"
               ,0x6b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(local_70._10_6_,local_70.desc) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70.desc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(local_70._10_6_,local_70.desc));
  }
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7ff8000000000000
  ;
  testing::internal::CmpHelperNE<flexfloat<(unsigned_char)2,(unsigned_char)47>,double>
            ((internal *)&local_70,"c","dynamicnan",
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> *)&local_58,(double *)&local_80);
  if (local_70.value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)CONCAT62(local_70._10_6_,local_70.desc) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT62(local_70._10_6_,local_70.desc);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/NanInf.cpp"
               ,0x70,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_78.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_78.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(local_70._10_6_,local_70.desc) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70.desc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(local_70._10_6_,local_70.desc));
  }
  return;
}

Assistant:

TEST(FloatxNanInfTest, DIV_2_47_simple)
{
    using T = flexfloat<2, 47>;
    T a = -(
        7.105427e-15 / 2 -
        1e-17);  // a bit smaller than half of the smallest subnormal in <2,47>
    T b = -(7.105427e-15 / 12.0);
    T c = 0;
    c = a / b;
    EXPECT_EQ(fp_t(a), 0.00000000000000000000);
    EXPECT_EQ(fp_t(b), 0.00000000000000000000);
    EXPECT_NE(c, c);    // holds only for NANs
    EXPECT_NE(c, nan);  // holds only for NANs

    fp_t zero = 0;
    fp_t dynamicnan = zero / zero;

    EXPECT_NE(c, dynamicnan);  // holds only for NANs
}